

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

int Acb_ObjIsCio(Acb_Ntk_t *p,int i)

{
  int iVar1;
  undefined1 local_15;
  int i_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsCi(p,i);
  local_15 = true;
  if (iVar1 == 0) {
    iVar1 = Acb_ObjIsCo(p,i);
    local_15 = iVar1 != 0;
  }
  return (int)local_15;
}

Assistant:

static inline int            Acb_ObjIsCio( Acb_Ntk_t * p, int i )                    { return Acb_ObjIsCi(p, i) || Acb_ObjIsCo(p, i);                                                       }